

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,unsigned_short>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>
           *__return_storage_ptr__,v10 *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unsigned_short *args_1)

{
  size_t sVar1;
  unsigned_short *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  undefined1 local_c9;
  char *local_c8;
  size_t local_c0;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  bool formattable;
  bool formattable_pointer;
  v10 *pvStack_b0;
  bool formattable_char;
  char *local_a8 [3];
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  longlong local_88;
  size_t local_80;
  v10 *local_78;
  undefined1 *local_70;
  basic_string_view<char> local_68;
  char **local_58;
  basic_string_view<char> local_50 [4];
  
  local_b1 = 1;
  local_b2 = 1;
  local_b3 = 1;
  local_70 = &local_c9;
  pvStack_b0 = this;
  local_78 = this;
  local_68 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_c8 = local_68.data_;
  local_c0 = local_68.size_;
  local_50[0].data_ = local_68.data_;
  local_50[0].size_ = local_68.size_;
  local_58 = local_a8;
  local_a8[0] = basic_string_view<char>::data(local_50);
  sVar1 = basic_string_view<char>::size(local_50);
  local_88._0_4_ = (uint)*(ushort *)args;
  (__return_storage_ptr__->data_).args_[0].field_0.string.data = local_a8[0];
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = sVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_88;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_80;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}